

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::Function::RegisterLoopMerge(Function *this,uint32_t merge_id,uint32_t continue_id)

{
  bitset<7UL> *pbVar1;
  BasicBlock **__args;
  BasicBlock *entry;
  mapped_type pBVar2;
  iterator __position;
  iterator iVar3;
  iterator iVar4;
  Construct *this_00;
  Construct *this_01;
  mapped_type *ppBVar5;
  iterator iVar6;
  vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *pvVar7;
  unordered_map<spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
  *this_02;
  __hashtable *__h;
  BasicBlock *block;
  BasicBlock *block_00;
  uint32_t local_e0;
  uint32_t local_dc;
  Construct local_d8;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_a8;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_88;
  BasicBlock *local_68;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_60;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_48;
  
  local_e0 = continue_id;
  local_dc = merge_id;
  RegisterBlock(this,merge_id,false);
  RegisterBlock(this,continue_id,false);
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->blocks_)._M_h,&local_dc);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>.
      _M_cur != (__node_type *)0x0) {
    iVar4 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->blocks_)._M_h,&local_e0);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>.
        _M_cur != (__node_type *)0x0) {
      if (this->current_block_ != (BasicBlock *)0x0) {
        block_00 = (BasicBlock *)
                   ((long)iVar3.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                          ._M_cur + 0x10);
        block = (BasicBlock *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                       ._M_cur + 0x10);
        BasicBlock::RegisterStructuralSuccessor(this->current_block_,block_00);
        BasicBlock::RegisterStructuralSuccessor(this->current_block_,block);
        entry = this->current_block_;
        pbVar1 = &entry->type_;
        (pbVar1->super__Base_bitset<1UL>)._M_w = (pbVar1->super__Base_bitset<1UL>)._M_w | 4;
        *(byte *)((long)iVar3.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                        ._M_cur + 0x60) =
             *(byte *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                             ._M_cur + 0x60) | 8;
        *(byte *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                        ._M_cur + 0x60) =
             *(byte *)((long)iVar4.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                             ._M_cur + 0x60) | 0x20;
        local_88.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Construct::Construct(&local_d8,kLoop,entry,block_00,&local_88);
        this_00 = AddConstruct(this,&local_d8);
        if (local_d8.corresponding_constructs_.
            super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.corresponding_constructs_.
                          super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.corresponding_constructs_.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.corresponding_constructs_.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_88.
            super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.
                          super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_a8.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Construct::Construct(&local_d8,kContinue,block,(BasicBlock *)0x0,&local_a8);
        this_01 = AddConstruct(this,&local_d8);
        if (local_d8.corresponding_constructs_.
            super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.corresponding_constructs_.
                          super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.corresponding_constructs_.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.corresponding_constructs_.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_a8.
            super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.
                          super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_a8.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_48.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
        local_48.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_48.
             super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
        *local_48.
         super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
         ._M_impl.super__Vector_impl_data._M_start = this_00;
        local_48.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_48.
             super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        Construct::set_corresponding_constructs(this_01,&local_48);
        if (local_48.
            super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_60.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
        local_60.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_60.
             super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
        *local_60.
         super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
         ._M_impl.super__Vector_impl_data._M_start = this_01;
        local_60.
        super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_60.
             super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        Construct::set_corresponding_constructs(this_00,&local_60);
        if (local_60.
            super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.
                          super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        __args = &this->current_block_;
        pBVar2 = this->current_block_;
        local_d8._0_8_ = block_00;
        ppBVar5 = std::__detail::
                  _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->merge_block_header_,(key_type *)&local_d8);
        *ppBVar5 = pBVar2;
        this_02 = &this->continue_target_headers_;
        local_d8._0_8_ = block;
        iVar6 = std::
                _Hashtable<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_02->_M_h,(key_type *)&local_d8);
        if (iVar6.
            super__Node_iterator_base<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          local_d8._0_8_ = *__args;
          local_68 = block;
          pvVar7 = (vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
                   std::__detail::
                   _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_02,&local_68);
          std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
          _M_assign_aux<spvtools::val::BasicBlock*const*>
                    (pvVar7,&local_d8,&local_d8.corresponding_constructs_);
        }
        else {
          local_d8._0_8_ = block;
          pvVar7 = (vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
                   std::__detail::
                   _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_02,(key_type *)&local_d8);
          __position._M_current = *(BasicBlock ***)(pvVar7 + 8);
          if (__position._M_current == *(BasicBlock ***)(pvVar7 + 0x10)) {
            std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
            _M_realloc_insert<spvtools::val::BasicBlock*const&>(pvVar7,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            *(long *)(pvVar7 + 8) = *(long *)(pvVar7 + 8) + 8;
          }
        }
        return SPV_SUCCESS;
      }
      __assert_fail("current_block_ && \"RegisterLoopMerge must be called when called within a block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/function.cpp"
                    ,0x4a,
                    "spv_result_t spvtools::val::Function::RegisterLoopMerge(uint32_t, uint32_t)");
    }
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

spv_result_t Function::RegisterLoopMerge(uint32_t merge_id,
                                         uint32_t continue_id) {
  RegisterBlock(merge_id, false);
  RegisterBlock(continue_id, false);
  BasicBlock& merge_block = blocks_.at(merge_id);
  BasicBlock& continue_target_block = blocks_.at(continue_id);
  assert(current_block_ &&
         "RegisterLoopMerge must be called when called within a block");
  current_block_->RegisterStructuralSuccessor(&merge_block);
  current_block_->RegisterStructuralSuccessor(&continue_target_block);

  current_block_->set_type(kBlockTypeLoop);
  merge_block.set_type(kBlockTypeMerge);
  continue_target_block.set_type(kBlockTypeContinue);
  Construct& loop_construct =
      AddConstruct({ConstructType::kLoop, current_block_, &merge_block});
  Construct& continue_construct =
      AddConstruct({ConstructType::kContinue, &continue_target_block});

  continue_construct.set_corresponding_constructs({&loop_construct});
  loop_construct.set_corresponding_constructs({&continue_construct});
  merge_block_header_[&merge_block] = current_block_;
  if (continue_target_headers_.find(&continue_target_block) ==
      continue_target_headers_.end()) {
    continue_target_headers_[&continue_target_block] = {current_block_};
  } else {
    continue_target_headers_[&continue_target_block].push_back(current_block_);
  }

  return SPV_SUCCESS;
}